

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::add_sub<true,false,unsigned_short>
               (unsigned_short source,unsigned_short *destination,Status *status)

{
  ushort value;
  unsigned_short uVar1;
  unsigned_short result;
  Status *status_local;
  unsigned_short *destination_local;
  unsigned_short source_local;
  
  value = *destination + source;
  status->carry_flag = (ulong)(value < *destination);
  status->extend_flag = status->carry_flag;
  status->zero_result = (ulong)value;
  Status::set_negative<unsigned_short>(status,value);
  uVar1 = Numeric::overflow<true,unsigned_short>(*destination,source,value);
  status->overflow_flag = (ulong)uVar1;
  *destination = value;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}